

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall despot::StateVar::~StateVar(StateVar *this)

{
  ~StateVar(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

StateVar::~StateVar() {
}